

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teleport.c
# Opt level: O1

boolean enexto_core_range(coord *cc,level *lev,xchar xx,xchar yy,permonst *mdat,uint entflags,
                         int start_range)

{
  bool bVar1;
  boolean bVar2;
  uint uVar3;
  long lVar4;
  undefined7 in_register_00000009;
  undefined7 in_register_00000011;
  long lVar5;
  int x;
  int x_00;
  int iVar6;
  int iVar7;
  xchar *pxVar8;
  int y;
  coord good [15];
  monst fakemon;
  xchar local_f8 [44];
  int local_cc;
  undefined8 local_c8;
  undefined8 local_c0;
  coord *local_b8;
  ulong local_b0;
  monst local_a8;
  
  local_c8 = CONCAT71(in_register_00000011,xx);
  local_c0 = CONCAT71(in_register_00000009,yy);
  local_a8.data = mons + u.umonster;
  if (mdat != (permonst *)0x0) {
    local_a8.data = mdat;
  }
  local_cc = 0x50;
  if (0x50 < start_range) {
    local_cc = start_range;
  }
  lVar5 = 0;
  local_b8 = cc;
  do {
    local_b0 = (ulong)(uint)start_range;
    x_00 = (int)local_c8 - start_range;
    if (x_00 < 2) {
      x_00 = 1;
    }
    x = start_range + (int)local_c8;
    if (0x4e < x) {
      x = 0x4f;
    }
    iVar6 = (int)local_c0 - start_range;
    if (iVar6 < 1) {
      iVar6 = 0;
    }
    y = start_range + (int)local_c0;
    if (0x13 < y) {
      y = 0x14;
    }
    lVar4 = lVar5;
    iVar7 = x_00;
    if (x_00 <= x) {
      do {
        bVar2 = goodpos(lev,iVar7,iVar6,&local_a8,entflags);
        lVar4 = lVar5;
        if (bVar2 != '\0') {
          local_f8[lVar5] = (xchar)iVar7;
          local_f8[lVar5 + 1] = (xchar)iVar6;
          lVar4 = lVar5 + 2;
          if (lVar5 == 0x1c) goto LAB_00258109;
        }
        bVar1 = iVar7 < x;
        lVar5 = lVar4;
        iVar7 = iVar7 + 1;
      } while (bVar1);
    }
    lVar5 = lVar4;
    iVar7 = x_00;
    if (x_00 <= x) {
      do {
        bVar2 = goodpos(lev,iVar7,y,&local_a8,entflags);
        lVar4 = lVar5;
        if (bVar2 != '\0') {
          local_f8[lVar5] = (xchar)iVar7;
          local_f8[lVar5 + 1] = (xchar)y;
          lVar4 = lVar5 + 2;
          if (lVar5 == 0x1c) goto LAB_00258109;
        }
        bVar1 = iVar7 < x;
        lVar5 = lVar4;
        iVar7 = iVar7 + 1;
      } while (bVar1);
    }
    iVar6 = iVar6 + 1;
    lVar5 = lVar4;
    for (iVar7 = iVar6; iVar7 < y; iVar7 = iVar7 + 1) {
      bVar2 = goodpos(lev,x_00,iVar7,&local_a8,entflags);
      lVar4 = lVar5;
      if (bVar2 != '\0') {
        local_f8[lVar5] = (xchar)x_00;
        local_f8[lVar5 + 1] = (xchar)iVar7;
        lVar4 = lVar5 + 2;
        if (lVar5 == 0x1c) goto LAB_00258109;
      }
      lVar5 = lVar4;
    }
    for (; pxVar8 = local_f8 + lVar5, iVar6 < y; iVar6 = iVar6 + 1) {
      bVar2 = goodpos(lev,x,iVar6,&local_a8,entflags);
      lVar4 = lVar5;
      if (bVar2 != '\0') {
        *pxVar8 = (xchar)x;
        local_f8[lVar5 + 1] = (xchar)iVar6;
        lVar4 = lVar5 + 2;
        if (lVar5 == 0x1c) goto LAB_00258109;
      }
      lVar5 = lVar4;
    }
    if ((int)local_b0 == local_cc) {
      return '\0';
    }
    start_range = (int)local_b0 + 1;
  } while (lVar5 == 0);
LAB_00258111:
  uVar3 = mt_random();
  lVar5 = SUB168(ZEXT416(uVar3) % SEXT816((long)(int)((ulong)((long)pxVar8 - (long)local_f8) >> 1)),
                 0);
  local_b8->x = local_f8[lVar5 * 2];
  local_b8->y = local_f8[lVar5 * 2 + 1];
  return '\x01';
LAB_00258109:
  pxVar8 = local_f8 + lVar4;
  goto LAB_00258111;
}

Assistant:

boolean enexto_core_range(coord *cc, struct level *lev, xchar xx, xchar yy,
			  const struct permonst *mdat, unsigned entflags,
			  int start_range) /* distance to begin tile check (>= 1) */
{
#define MAX_GOOD 15
    coord good[MAX_GOOD], *good_ptr;
    int x, y, range, i;
    int xmin, xmax, ymin, ymax;
    struct monst fakemon;	/* dummy monster */

    if (!mdat) {
	/* default to player's original monster type */
	mdat = &mons[u.umonster];
    }
    
    fakemon.data = mdat;	/* set up for goodpos */
    good_ptr = good;
    range = start_range;
    /*
     * Walk around the border of the square with center (xx,yy) and
     * radius range.  Stop when we find at least one valid position.
     */
    do {
	xmin = max(1, xx-range);
	xmax = min(COLNO-1, xx+range);
	ymin = max(0, yy-range);
	ymax = min(ROWNO-1, yy+range);

	for (x = xmin; x <= xmax; x++)
	    if (goodpos(lev, x, ymin, &fakemon, entflags)) {
		good_ptr->x = x;
		good_ptr->y = ymin ;
		/* beware of accessing beyond segment boundaries.. */
		if (good_ptr++ == &good[MAX_GOOD-1]) goto full;
	    }
	for (x = xmin; x <= xmax; x++)
	    if (goodpos(lev, x, ymax, &fakemon, entflags)) {
		good_ptr->x = x;
		good_ptr->y = ymax ;
		/* beware of accessing beyond segment boundaries.. */
		if (good_ptr++ == &good[MAX_GOOD-1]) goto full;
	    }
	for (y = ymin+1; y < ymax; y++)
	    if (goodpos(lev, xmin, y, &fakemon, entflags)) {
		good_ptr->x = xmin;
		good_ptr-> y = y ;
		/* beware of accessing beyond segment boundaries.. */
		if (good_ptr++ == &good[MAX_GOOD-1]) goto full;
	    }
	for (y = ymin+1; y < ymax; y++)
	    if (goodpos(lev, xmax, y, &fakemon, entflags)) {
		good_ptr->x = xmax;
		good_ptr->y = y ;
		/* beware of accessing beyond segment boundaries.. */
		if (good_ptr++ == &good[MAX_GOOD-1]) goto full;
	    }
	range++;

	/* return if we've grown too big (nothing is valid) */
	if (range > ROWNO && range > COLNO) return FALSE;
    } while (good_ptr == good);

full:
    i = rn2((int)(good_ptr - good));
    cc->x = good[i].x;
    cc->y = good[i].y;
    return TRUE;
}